

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctred.c
# Opt level: O2

void jpeg_idct_2x2(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  short sVar5;
  uint uVar6;
  JSAMPLE JVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int aiStack_68 [8];
  int aiStack_48 [2];
  int workspace [16];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  uVar6 = 8;
  lVar8 = 0;
  do {
    if ((int)lVar8 == 0x10) {
      uVar11 = (ulong)output_col;
      for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 8) {
        lVar9 = *(long *)((long)output_buf + lVar8);
        iVar10 = aiStack_68[lVar8 + 3];
        if (((iVar10 == 0 && aiStack_68[lVar8 + 1] == 0) && (iVar10 = 0, aiStack_68[lVar8 + 5] == 0)
            ) && (aiStack_68[lVar8 + 7] == 0)) {
          JVar7 = pJVar3[(ulong)(aiStack_68[lVar8] + 0x10U >> 5 & 0x3ff) + 0x80];
          *(JSAMPLE *)(lVar9 + uVar11) = JVar7;
        }
        else {
          iVar2 = aiStack_68[lVar8];
          iVar10 = aiStack_68[lVar8 + 1] * 0x73fc + aiStack_68[lVar8 + 7] * -0x1712 +
                   iVar10 * -0x28ba + aiStack_68[lVar8 + 5] * 0x1b37;
          *(JSAMPLE *)(lVar9 + uVar11) =
               pJVar3[(ulong)(iVar2 * 0x8000 + iVar10 + 0x80000U >> 0x14 & 0x3ff) + 0x80];
          JVar7 = pJVar3[(ulong)((uint)((iVar2 * 0x8000 + 0x80000) - iVar10) >> 0x14 & 0x3ff) + 0x80
                        ];
        }
        *(JSAMPLE *)(lVar9 + 1 + uVar11) = JVar7;
      }
      return;
    }
    if (((int)lVar8 != 0xc) && ((uVar6 & 0x7ffffffd) != 4)) {
      sVar1 = *(short *)((long)coef_block + lVar8 + 0x10);
      sVar5 = *(short *)((long)coef_block + lVar8 + 0x30);
      if (sVar5 == 0 && sVar1 == 0) {
        if ((*(short *)((long)coef_block + lVar8 + 0x50) != 0) ||
           (*(short *)((long)coef_block + lVar8 + 0x70) != 0)) {
          sVar5 = 0;
          goto LAB_0012e42b;
        }
        iVar10 = (int)*(short *)((long)pvVar4 + lVar8) * (int)*(short *)((long)coef_block + lVar8) *
                 4;
        *(int *)((long)aiStack_68 + lVar8 * 2) = iVar10;
      }
      else {
LAB_0012e42b:
        uVar11 = (long)*(short *)((long)pvVar4 + lVar8) * (long)*(short *)((long)coef_block + lVar8)
                 * 0x8000;
        lVar9 = (long)sVar1 * (long)*(short *)((long)pvVar4 + lVar8 + 0x10) * 0x73fc +
                (long)*(short *)((long)pvVar4 + lVar8 + 0x30) * (long)sVar5 * -0x28ba +
                (long)*(short *)((long)pvVar4 + lVar8 + 0x50) *
                (long)*(short *)((long)coef_block + lVar8 + 0x50) * 0x1b37 +
                (long)*(short *)((long)pvVar4 + lVar8 + 0x70) *
                (long)*(short *)((long)coef_block + lVar8 + 0x70) * -0x1712;
        *(int *)((long)aiStack_68 + lVar8 * 2) = (int)(uVar11 + lVar9 + 0x1000 >> 0xd);
        iVar10 = (int)((uVar11 | 0x1000) - lVar9 >> 0xd);
      }
      *(int *)((long)workspace + lVar8 * 2 + -8) = iVar10;
    }
    uVar6 = uVar6 - 1;
    lVar8 = lVar8 + 2;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_2x2(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp10, z1;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE * 2];   /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; inptr++, quantptr++, wsptr++, ctr--) {
    /* Don't bother to process columns 2,4,6 */
    if (ctr == DCTSIZE - 2 || ctr == DCTSIZE - 4 || ctr == DCTSIZE - 6)
      continue;
    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 3] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero; we need not examine terms 2,4,6 for 2x2 output */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                             quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;

      continue;
    }

    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp10 = LEFT_SHIFT(z1, CONST_BITS + 2);

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp0 = MULTIPLY(z1, -FIX_0_720959822);  /* sqrt(2) * ( c7-c5+c3-c1) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp0 += MULTIPLY(z1, FIX_0_850430095);  /* sqrt(2) * (-c1+c3+c5+c7) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp0 += MULTIPLY(z1, -FIX_1_272758580); /* sqrt(2) * (-c1+c3-c5-c7) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    tmp0 += MULTIPLY(z1, FIX_3_624509785);  /* sqrt(2) * ( c1+c3+c5+c7) */

    /* Final output stage */

    wsptr[DCTSIZE * 0] =
      (int)DESCALE(tmp10 + tmp0, CONST_BITS - PASS1_BITS + 2);
    wsptr[DCTSIZE * 1] =
      (int)DESCALE(tmp10 - tmp0, CONST_BITS - PASS1_BITS + 2);
  }

  /* Pass 2: process 2 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 2; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* It's not clear whether a zero row test is worthwhile here ... */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[3] == 0 && wsptr[5] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp10 = LEFT_SHIFT((JLONG)wsptr[0], CONST_BITS + 2);

    /* Odd part */

    tmp0 = MULTIPLY((JLONG)wsptr[7], -FIX_0_720959822) + /* sqrt(2) * ( c7-c5+c3-c1) */
           MULTIPLY((JLONG)wsptr[5],  FIX_0_850430095) + /* sqrt(2) * (-c1+c3+c5+c7) */
           MULTIPLY((JLONG)wsptr[3], -FIX_1_272758580) + /* sqrt(2) * (-c1+c3-c5-c7) */
           MULTIPLY((JLONG)wsptr[1],  FIX_3_624509785);  /* sqrt(2) * ( c1+c3+c5+c7) */

    /* Final output stage */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 2) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp10 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 2) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}